

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

string * pfederc::logCreateErrorMessage
                   (string *__return_storage_ptr__,Lexer *lexer,Position *pos,string *msg)

{
  pointer pcVar1;
  bool bVar2;
  Position *pPVar3;
  string *psVar4;
  char cVar5;
  byte bVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_t sVar9;
  ulong *puVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  char cVar14;
  undefined8 uVar15;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  string __str;
  string __str_1;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  Position *local_108;
  string local_100;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  undefined8 uStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  string local_a0;
  ulong local_80;
  ulong *local_78;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68 [2];
  string *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar1 = (lexer->filePath)._M_dataplus._M_p;
  local_108 = pos;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (lexer->filePath)._M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  uVar13 = local_108->line + 1;
  cVar14 = '\x01';
  if (9 < uVar13) {
    uVar16 = uVar13;
    cVar5 = '\x04';
    do {
      cVar14 = cVar5;
      if (uVar16 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_001081c7;
      }
      if (uVar16 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_001081c7;
      }
      if (uVar16 < 10000) goto LAB_001081c7;
      bVar2 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar5 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
  }
LAB_001081c7:
  local_128 = &local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_128,(uint)local_120,uVar13);
  uVar13 = 0xf;
  if (local_c0 != &local_b0) {
    uVar13 = local_b0;
  }
  if (uVar13 < (ulong)(local_120 + local_b8)) {
    uVar13 = 0xf;
    if (local_128 != &local_118) {
      uVar13 = local_118;
    }
    if (uVar13 < (ulong)(local_120 + local_b8)) goto LAB_0010822d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_0010822d:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_128);
  }
  local_e0 = &local_d0;
  puVar10 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar10) {
    local_d0 = *puVar10;
    uStack_c8 = puVar7[3];
  }
  else {
    local_d0 = *puVar10;
    local_e0 = (ulong *)*puVar7;
  }
  local_d8 = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  puVar10 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_a0.field_2._M_allocated_capacity = *puVar10;
    local_a0.field_2._8_8_ = plVar8[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *puVar10;
    local_a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_a0._M_string_length = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar13 = (local_108->startIndex -
           (lexer->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[local_108->line]) + 1;
  cVar14 = '\x01';
  if (9 < uVar13) {
    uVar16 = uVar13;
    cVar5 = '\x04';
    do {
      cVar14 = cVar5;
      if (uVar16 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_00108363;
      }
      if (uVar16 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_00108363;
      }
      if (uVar16 < 10000) goto LAB_00108363;
      bVar2 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar5 = cVar14 + '\x04';
    } while (bVar2);
    cVar14 = cVar14 + '\x01';
  }
LAB_00108363:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,local_70,uVar13);
  uVar13 = CONCAT44(uStack_6c,local_70) + local_a0._M_string_length;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    uVar15 = local_a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < uVar13) {
    uVar16 = 0xf;
    if (local_78 != local_68) {
      uVar16 = local_68[0];
    }
    if (uVar16 < uVar13) goto LAB_001083ee;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_78,0,(char *)0x0,(ulong)local_a0._M_dataplus._M_p);
  }
  else {
LAB_001083ee:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  psVar12 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_100.field_2._M_allocated_capacity = *psVar12;
    local_100.field_2._8_8_ = puVar7[3];
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar12;
    local_100._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_100._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_50 = &local_40;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_40 = *plVar11;
    lStack_38 = plVar8[3];
  }
  else {
    local_40 = *plVar11;
    local_50 = (long *)*plVar8;
  }
  local_48 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)(msg->_M_dataplus)._M_p)
  ;
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_b0 = *puVar10;
    lStack_a8 = plVar8[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar10;
    local_c0 = (ulong *)*plVar8;
  }
  local_b8 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
  puVar10 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar10) {
    local_d0 = *puVar10;
    uStack_c8 = puVar7[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar10;
    local_e0 = (ulong *)*puVar7;
  }
  local_d8 = puVar7[1];
  *puVar7 = puVar10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  Lexer::getLineAt_abi_cxx11_(&local_100,lexer,local_108->line);
  plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_100,local_100._M_string_length,0,'\x01');
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_118 = *puVar10;
    lStack_110 = plVar8[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *puVar10;
    local_128 = (ulong *)*plVar8;
  }
  local_120 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_58 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pPVar3 = local_108;
  sVar9 = Lexer::getLineNumber(lexer,local_108->startIndex);
  uVar13 = (lexer->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar9];
  Lexer::getLineNumber(lexer,pPVar3->endIndex);
  sVar9 = pPVar3->endIndex;
  local_80 = pPVar3->startIndex;
  if (pPVar3->startIndex <= sVar9) {
    local_80 = sVar9;
  }
  sVar9 = Lexer::getLineNumber(lexer,sVar9);
  uVar16 = pPVar3->line;
  if (uVar16 < sVar9) {
    do {
      Lexer::getLineAt_abi_cxx11_(&local_a0,lexer,uVar16);
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_replace_aux
                         ((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar12 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_100.field_2._M_allocated_capacity = *psVar12;
        local_100.field_2._8_8_ = puVar7[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar12;
        local_100._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_100._M_string_length = puVar7[1];
      *puVar7 = psVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 <= sVar9);
  }
  uVar16 = local_108->startIndex;
  if ((uVar13 < uVar16) && (uVar13 < (lexer->fileContent)._M_string_length)) {
    do {
      uVar17 = uVar13 + 1;
      bVar6 = (lexer->fileContent)._M_dataplus._M_p[uVar13];
      if (bVar6 == 9) {
        std::__cxx11::string::append((char *)&local_128);
      }
      else if (-0x11 < (char)bVar6 || (bVar6 & 0xd0) == 0xc0) {
        std::__cxx11::string::push_back((char)&local_128);
      }
      uVar16 = local_108->startIndex;
    } while ((uVar17 < uVar16) && (uVar13 = uVar17, uVar17 < (lexer->fileContent)._M_string_length))
    ;
  }
  if (uVar16 <= local_80) {
    do {
      uVar13 = (lexer->fileContent)._M_string_length;
      if (uVar13 < uVar16) break;
      bVar6 = 0x20;
      if (uVar16 != uVar13) {
        bVar6 = (lexer->fileContent)._M_dataplus._M_p[uVar16];
      }
      if (bVar6 == 9) {
        std::__cxx11::string::append((char *)&local_128);
      }
      else if (-0x11 < (char)bVar6 || (bVar6 & 0xd0) == 0xc0) {
        std::__cxx11::string::push_back((char)&local_128);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 <= local_80);
  }
  psVar4 = local_58;
  uVar13 = 0xf;
  if (local_e0 != &local_d0) {
    uVar13 = local_d0;
  }
  if (uVar13 < (ulong)(local_120 + local_d8)) {
    uVar13 = 0xf;
    if (local_128 != &local_118) {
      uVar13 = local_118;
    }
    if ((ulong)(local_120 + local_d8) <= uVar13) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_e0);
      goto LAB_0010892d;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_128);
LAB_0010892d:
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  psVar12 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar12) {
    uVar15 = puVar7[3];
    (psVar4->field_2)._M_allocated_capacity = *psVar12;
    *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar15;
  }
  else {
    (psVar4->_M_dataplus)._M_p = (pointer)*puVar7;
    (psVar4->field_2)._M_allocated_capacity = *psVar12;
  }
  psVar4->_M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  return psVar4;
}

Assistant:

std::string pfederc::logCreateErrorMessage(const Lexer &lexer, const Position &pos, const std::string &msg) noexcept {
  return _logLexerErrorBase(lexer, pos) + msg + "\n" + _logLexerErrorMark(lexer, pos);
}